

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentHeader.cpp
# Opt level: O3

void __thiscall
Rml::DocumentHeader::MergePaths
          (DocumentHeader *this,StringList *target,StringList *source,String *source_path)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  ulong uVar4;
  SystemInterface *pSVar5;
  String joined_path;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  String local_f8;
  long local_d8;
  StringList *local_d0;
  String local_c8;
  String local_a8;
  String local_88;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  String *local_60;
  ulong local_58;
  String local_50;
  
  if ((source->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (source->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_d8 = 8;
    local_58 = 0;
    local_d0 = source;
    local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)target;
    local_60 = source_path;
    do {
      local_118 = &local_108;
      local_110 = 0;
      local_108 = 0;
      pSVar5 = GetSystemInterface();
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar1 = (local_60->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + local_60->_M_string_length);
      StringUtilities::Replace(&local_f8,&local_88,'|',':');
      pbVar2 = (local_d0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      lVar3 = *(long *)((long)pbVar2 + local_d8 + -8);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,lVar3,
                 *(long *)((long)&(pbVar2->_M_dataplus)._M_p + local_d8) + lVar3);
      StringUtilities::Replace(&local_50,&local_a8,'|',':');
      (*pSVar5->_vptr_SystemInterface[4])(pSVar5,&local_118,&local_f8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_118,local_118 + local_110);
      StringUtilities::Replace(&local_f8,&local_c8,':','|');
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_68,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      uVar4 = local_58;
      if (local_118 != &local_108) {
        operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
      }
      local_58 = uVar4 + 1;
      local_d8 = local_d8 + 0x20;
    } while (local_58 <
             (ulong)((long)(local_d0->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_d0->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return;
}

Assistant:

void DocumentHeader::MergePaths(StringList& target, const StringList& source, const String& source_path)
{
	for (size_t i = 0; i < source.size(); i++)
	{
		String joined_path;
		::Rml::GetSystemInterface()->JoinPath(joined_path, StringUtilities::Replace(source_path, '|', ':'),
			StringUtilities::Replace(source[i], '|', ':'));

		target.push_back(StringUtilities::Replace(joined_path, ':', '|'));
	}
}